

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readStringSingleQuote(OurReader *this)

{
  Char local_11;
  Char c;
  OurReader *this_local;
  
  local_11 = '\0';
  do {
    while( true ) {
      if (this->current_ == this->end_) goto LAB_00b2664b;
      local_11 = getNextChar(this);
      if (local_11 != '\\') break;
      getNextChar(this);
    }
  } while (local_11 != '\'');
LAB_00b2664b:
  return local_11 == '\'';
}

Assistant:

bool OurReader::readStringSingleQuote() {
  Char c = 0;
  while (current_ != end_) {
    c = getNextChar();
    if (c == '\\')
      getNextChar();
    else if (c == '\'')
      break;
  }
  return c == '\'';
}